

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O2

void __thiscall smf::MidiMessage::MidiMessage(MidiMessage *this,int command)

{
  undefined8 in_RAX;
  undefined1 auStack_8 [7];
  value_type_conflict local_1;
  
  _auStack_8 = CONCAT17((char)command,SUB87(in_RAX,0));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,1,&local_1,
             (allocator_type *)(auStack_8 + 6));
  return;
}

Assistant:

MidiMessage::MidiMessage(int command) : vector<uchar>(1, (uchar)command) {
	// do nothing
}